

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O0

void __thiscall
spvtools::opt::LoopPeeling::InsertCanonicalInductionVariable
          (LoopPeeling *this,LoopCloningResult *clone_results)

{
  IRContext *context;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> __l;
  undefined8 this_00;
  bool bVar1;
  Analysis preserved_analyses;
  uint32_t uVar2;
  uint32_t op1;
  uint32_t op2;
  DefUseManager *pDVar3;
  mapped_type *pmVar4;
  Instruction *pIVar5;
  Loop *pLVar6;
  BasicBlock *pBVar7;
  uint32_t local_dc;
  iterator local_d8;
  undefined8 local_d0;
  SmallVector<unsigned_int,_2UL> local_c8;
  allocator<unsigned_int> local_99;
  uint32_t local_98;
  uint32_t local_94;
  uint32_t local_90;
  uint32_t local_8c;
  iterator local_88;
  size_type local_80;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  undefined1 local_60 [16];
  Instruction *iv_inc;
  Instruction *uint_1_cst;
  InstructionBuilder builder;
  iterator insert_point;
  LoopCloningResult *clone_results_local;
  LoopPeeling *this_local;
  
  if (this->original_loop_canonical_induction_variable_ == (Instruction *)0x0) {
    pLVar6 = GetClonedLoop(this);
    Loop::GetLatchBlock(pLVar6);
    BasicBlock::tail((BasicBlock *)&builder.preserved_analyses_);
    pLVar6 = GetClonedLoop(this);
    pBVar7 = Loop::GetLatchBlock(pLVar6);
    pIVar5 = BasicBlock::GetMergeInst(pBVar7);
    if (pIVar5 != (Instruction *)0x0) {
      InstructionList::iterator::operator--((iterator *)&builder.preserved_analyses_);
    }
    context = this->context_;
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)
                        &builder.preserved_analyses_);
    preserved_analyses = operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
    InstructionBuilder::InstructionBuilder
              ((InstructionBuilder *)&uint_1_cst,context,pIVar5,preserved_analyses);
    bVar1 = analysis::Integer::IsSigned(this->int_type_);
    iv_inc = InstructionBuilder::GetIntConstant<unsigned_int>
                       ((InstructionBuilder *)&uint_1_cst,1,bVar1);
    uVar2 = Instruction::type_id(iv_inc);
    op1 = Instruction::result_id(iv_inc);
    op2 = Instruction::result_id(iv_inc);
    local_60._8_8_ = InstructionBuilder::AddIAdd((InstructionBuilder *)&uint_1_cst,uVar2,op1,op2);
    pLVar6 = GetClonedLoop(this);
    Loop::GetHeaderBlock(pLVar6);
    BasicBlock::begin((BasicBlock *)local_60);
    pIVar5 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)local_60);
    InstructionBuilder::SetInsertPoint((InstructionBuilder *)&uint_1_cst,pIVar5);
    uVar2 = Instruction::type_id(iv_inc);
    bVar1 = analysis::Integer::IsSigned(this->int_type_);
    pIVar5 = InstructionBuilder::GetIntConstant<unsigned_int>
                       ((InstructionBuilder *)&uint_1_cst,0,bVar1);
    local_98 = Instruction::result_id(pIVar5);
    pLVar6 = GetClonedLoop(this);
    pBVar7 = Loop::GetPreHeaderBlock(pLVar6);
    local_94 = BasicBlock::id(pBVar7);
    local_90 = Instruction::result_id((Instruction *)local_60._8_8_);
    pLVar6 = GetClonedLoop(this);
    pBVar7 = Loop::GetLatchBlock(pLVar6);
    local_8c = BasicBlock::id(pBVar7);
    local_88 = &local_98;
    local_80 = 4;
    std::allocator<unsigned_int>::allocator(&local_99);
    __l._M_len = local_80;
    __l._M_array = local_88;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_78,__l,&local_99);
    pIVar5 = InstructionBuilder::AddPhi((InstructionBuilder *)&uint_1_cst,uVar2,&local_78,0);
    this->canonical_induction_variable_ = pIVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_78);
    std::allocator<unsigned_int>::~allocator(&local_99);
    this_00 = local_60._8_8_;
    local_dc = Instruction::result_id(this->canonical_induction_variable_);
    local_d8 = &local_dc;
    local_d0 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_d8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_c8,init_list);
    Instruction::SetInOperand((Instruction *)this_00,0,&local_c8);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_c8);
    pDVar3 = IRContext::get_def_use_mgr(this->context_);
    analysis::DefUseManager::AnalyzeInstUse(pDVar3,(Instruction *)local_60._8_8_);
    if ((this->do_while_form_ & 1U) != 0) {
      this->canonical_induction_variable_ = (Instruction *)local_60._8_8_;
    }
  }
  else {
    pDVar3 = IRContext::get_def_use_mgr(this->context_);
    insert_point.super_iterator.node_._4_4_ =
         Instruction::result_id(this->original_loop_canonical_induction_variable_);
    pmVar4 = std::
             unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::at(&clone_results->value_map_,
                  (key_type *)((long)&insert_point.super_iterator.node_ + 4));
    pIVar5 = analysis::DefUseManager::GetDef(pDVar3,*pmVar4);
    this->canonical_induction_variable_ = pIVar5;
  }
  return;
}

Assistant:

void LoopPeeling::InsertCanonicalInductionVariable(
    LoopUtils::LoopCloningResult* clone_results) {
  if (original_loop_canonical_induction_variable_) {
    canonical_induction_variable_ =
        context_->get_def_use_mgr()->GetDef(clone_results->value_map_.at(
            original_loop_canonical_induction_variable_->result_id()));
    return;
  }

  BasicBlock::iterator insert_point = GetClonedLoop()->GetLatchBlock()->tail();
  if (GetClonedLoop()->GetLatchBlock()->GetMergeInst()) {
    --insert_point;
  }
  InstructionBuilder builder(
      context_, &*insert_point,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);
  Instruction* uint_1_cst =
      builder.GetIntConstant<uint32_t>(1, int_type_->IsSigned());
  // Create the increment.
  // Note that we do "1 + 1" here, one of the operand should the phi
  // value but we don't have it yet. The operand will be set latter.
  Instruction* iv_inc = builder.AddIAdd(
      uint_1_cst->type_id(), uint_1_cst->result_id(), uint_1_cst->result_id());

  builder.SetInsertPoint(&*GetClonedLoop()->GetHeaderBlock()->begin());

  canonical_induction_variable_ = builder.AddPhi(
      uint_1_cst->type_id(),
      {builder.GetIntConstant<uint32_t>(0, int_type_->IsSigned())->result_id(),
       GetClonedLoop()->GetPreHeaderBlock()->id(), iv_inc->result_id(),
       GetClonedLoop()->GetLatchBlock()->id()});
  // Connect everything.
  iv_inc->SetInOperand(0, {canonical_induction_variable_->result_id()});

  // Update def/use manager.
  context_->get_def_use_mgr()->AnalyzeInstUse(iv_inc);

  // If do-while form, use the incremented value.
  if (do_while_form_) {
    canonical_induction_variable_ = iv_inc;
  }
}